

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# budCovEntries.cpp
# Opt level: O2

cl_int clGetDeviceIDs(cl_platform_id platform,cl_device_type device_type,cl_uint num_entries,
                     cl_device_id *devices,cl_uint *num_devices)

{
  bool bVar1;
  cl_int cVar2;
  
  if ((platform == (cl_platform_id)0x0) || (platform[8] != (_cl_platform_id)0x1)) {
    return -0x20;
  }
  if (((device_type < 9) && ((0x116UL >> (device_type & 0x3f) & 1) != 0)) ||
     (device_type == 0xffffffff)) {
    bVar1 = num_entries != 0;
    if (devices == (cl_device_id *)0x0) {
      bVar1 = num_devices != (cl_uint *)0x0;
    }
    if (bVar1) {
      if (device_type == 2) {
        return -1;
      }
      if (device_type == 8) {
        return -1;
      }
      if (num_devices != (cl_uint *)0x0) {
        *num_devices = 1;
      }
      if (num_entries != 0 && devices != (cl_device_id *)0x0) {
        if (cov::g_device[9] != '\x01') {
          return -6;
        }
        *devices = (cl_device_id)cov::g_device;
      }
      return 0;
    }
    cVar2 = -0x1e;
  }
  else {
    cVar2 = -0x1f;
  }
  return cVar2;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL
clGetDeviceIDs(cl_platform_id platform,
               cl_device_type device_type,
               cl_uint num_entries,
               cl_device_id* devices,
               cl_uint* num_devices) CL_API_SUFFIX__VERSION_1_0
{
    if (!platform || !cov::isValidObject<cov::Platform>(platform)) return CL_INVALID_PLATFORM;
    if (device_type != CL_DEVICE_TYPE_ALL &&
        device_type != CL_DEVICE_TYPE_DEFAULT &&
        device_type != CL_DEVICE_TYPE_CPU &&
        device_type != CL_DEVICE_TYPE_GPU &&
        device_type != CL_DEVICE_TYPE_ACCELERATOR) return CL_INVALID_DEVICE_TYPE;
    if (num_entries == 0 && devices) return CL_INVALID_VALUE;
    if (!devices && !num_devices) return CL_INVALID_VALUE;
    // Support GPU only because vulkan only runs on GPU
    if (device_type == CL_DEVICE_TYPE_CPU || device_type == CL_DEVICE_TYPE_ACCELERATOR) return CL_DEVICE_NOT_FOUND;

    return cov::getDeviceIDs(platform, device_type, num_entries, devices, num_devices);
}